

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

void do_predtest1(TCGContext_conflict1 *tcg_ctx,TCGv_i64 d,TCGv_i64 g)

{
  TCGv_i32 t;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  
  t = tcg_temp_new_i32(tcg_ctx);
  local_38 = (TCGTemp *)(d + (long)tcg_ctx);
  local_30 = g + (long)tcg_ctx;
  tcg_gen_callN_aarch64
            (tcg_ctx,helper_sve_predtest1_aarch64,(TCGTemp *)(t + (long)&tcg_ctx->pool_cur),2,
             &local_38);
  do_pred_flags(tcg_ctx,t);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(t + (long)&tcg_ctx->pool_cur));
  return;
}

Assistant:

static void do_predtest1(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 g)
{
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    gen_helper_sve_predtest1(tcg_ctx, t, d, g);
    do_pred_flags(tcg_ctx, t);
    tcg_temp_free_i32(tcg_ctx, t);
}